

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

void Tas_ManAssign(Tas_Man_t *p,Gia_Obj_t *pObj,int Level,Gia_Obj_t *pRes0,Gia_Obj_t *pRes1)

{
  uint uVar1;
  int Entry;
  int Entry_00;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  
  pObj_00 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = (uint)*(ulong *)pObj_00;
  if (((~uVar1 & 0x9fffffff) != 0) && ((int)uVar1 < 0 || (~uVar1 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x291,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    __assert_fail("!Tas_VarIsAssigned(pObjR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x292,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  *(ulong *)pObj_00 =
       (*(ulong *)pObj_00 & 0xbfffffffbfffffff | (ulong)((uint)pObj & 1) << 0x3e) ^
       0x4000000040000000;
  if (pObj_00->Value != 0xffffffff) {
    __assert_fail("pObjR->Value == ~0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x295,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  pObj_00->Value = (p->pProp).iTail;
  Tas_QuePush(&p->pProp,pObj_00);
  Vec_IntPush(p->vLevReas,Level);
  if (pRes1 == (Gia_Obj_t *)0x0 || pRes0 != (Gia_Obj_t *)0x0) {
    Entry = 0;
    Entry_00 = 0;
    if (pRes0 != (Gia_Obj_t *)0x0) {
      Entry_00 = (int)(((long)pRes0 - (long)pObj_00) / 0xc);
    }
    Vec_IntPush(p->vLevReas,Entry_00);
    p_00 = p->vLevReas;
    if (pRes1 != (Gia_Obj_t *)0x0) {
      Entry = (int)(((long)pRes1 - (long)pObj_00) / 0xc);
    }
  }
  else {
    Vec_IntPush(p->vLevReas,0);
    p_00 = p->vLevReas;
    Entry = (int)((ulong)((long)pRes1 - (long)(p->pStore).pData) >> 2);
  }
  Vec_IntPush(p_00,Entry);
  if (p->vLevReas->nSize != (p->pProp).iTail * 3) {
    __assert_fail("Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2a3,
                  "void Tas_ManAssign(Tas_Man_t *, Gia_Obj_t *, int, Gia_Obj_t *, Gia_Obj_t *)");
  }
  s_Counter2 = s_Counter2 + 1;
  return;
}

Assistant:

static inline void Tas_ManAssign( Tas_Man_t * p, Gia_Obj_t * pObj, int Level, Gia_Obj_t * pRes0, Gia_Obj_t * pRes1 )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Tas_VarIsAssigned(pObjR) );
    Tas_VarAssign( pObjR );
    Tas_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    assert( pObjR->Value == ~0 );
    pObjR->Value = p->pProp.iTail;
    Tas_QuePush( &p->pProp, pObjR );
    Vec_IntPush( p->vLevReas, Level );
    if ( pRes0 == NULL && pRes1 != 0 ) // clause
    {
        Vec_IntPush( p->vLevReas, 0 );
        Vec_IntPush( p->vLevReas, Tas_ClsHandle( p, (Tas_Cls_t *)pRes1 ) );
    }
    else
    {
        Vec_IntPush( p->vLevReas, pRes0 ? pRes0-pObjR : 0 );
        Vec_IntPush( p->vLevReas, pRes1 ? pRes1-pObjR : 0 );
    }
    assert( Vec_IntSize(p->vLevReas) == 3 * p->pProp.iTail );
    s_Counter2++;
}